

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

int xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr_conflict define)

{
  xmlRelaxNGDefinePtr_conflict local_30;
  xmlRelaxNGDefinePtr_conflict list_1;
  xmlRelaxNGDefinePtr_conflict list;
  int ret;
  xmlRelaxNGDefinePtr_conflict define_local;
  
  if (define == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return -1;
  }
  if ((define->dflags & 1U) != 0) {
    return 1;
  }
  if ((define->dflags & 2U) != 0) {
    return 0;
  }
  switch(define->type) {
  case XML_RELAXNG_EMPTY:
  case XML_RELAXNG_TEXT:
    list._4_4_ = 1;
    break;
  case XML_RELAXNG_NOT_ALLOWED:
  case XML_RELAXNG_EXCEPT:
  case XML_RELAXNG_ELEMENT:
  case XML_RELAXNG_DATATYPE:
  case XML_RELAXNG_PARAM:
  case XML_RELAXNG_VALUE:
  case XML_RELAXNG_LIST:
  case XML_RELAXNG_ATTRIBUTE:
    list._4_4_ = 0;
    break;
  default:
    return -1;
  case XML_RELAXNG_CHOICE:
    for (list_1 = define->content; list_1 != (xmlRelaxNGDefinePtr_conflict)0x0;
        list_1 = list_1->next) {
      list._4_4_ = xmlRelaxNGIsNullable(list_1);
      if (list._4_4_ != 0) goto LAB_001cafe6;
    }
    list._4_4_ = 0;
    break;
  case XML_RELAXNG_GROUP:
  case XML_RELAXNG_INTERLEAVE:
  case XML_RELAXNG_START:
    local_30 = define->content;
    while( true ) {
      if (local_30 == (xmlRelaxNGDefinePtr_conflict)0x0) {
        return 1;
      }
      list._4_4_ = xmlRelaxNGIsNullable(local_30);
      if (list._4_4_ != 1) break;
      local_30 = local_30->next;
    }
    break;
  case XML_RELAXNG_NOOP:
  case XML_RELAXNG_DEF:
  case XML_RELAXNG_REF:
  case XML_RELAXNG_EXTERNALREF:
  case XML_RELAXNG_PARENTREF:
  case XML_RELAXNG_ONEORMORE:
    list._4_4_ = xmlRelaxNGIsNullable(define->content);
  }
LAB_001cafe6:
  if (list._4_4_ == 0) {
    define->dflags = define->dflags | 2;
  }
  if (list._4_4_ == 1) {
    define->dflags = define->dflags | 1;
  }
  return list._4_4_;
}

Assistant:

static int
xmlRelaxNGIsNullable(xmlRelaxNGDefinePtr define)
{
    int ret;

    if (define == NULL)
        return (-1);

    if (define->dflags & IS_NULLABLE)
        return (1);
    if (define->dflags & IS_NOT_NULLABLE)
        return (0);
    switch (define->type) {
        case XML_RELAXNG_EMPTY:
        case XML_RELAXNG_TEXT:
            ret = 1;
            break;
        case XML_RELAXNG_NOOP:
        case XML_RELAXNG_DEF:
        case XML_RELAXNG_REF:
        case XML_RELAXNG_EXTERNALREF:
        case XML_RELAXNG_PARENTREF:
        case XML_RELAXNG_ONEORMORE:
            ret = xmlRelaxNGIsNullable(define->content);
            break;
        case XML_RELAXNG_EXCEPT:
        case XML_RELAXNG_NOT_ALLOWED:
        case XML_RELAXNG_ELEMENT:
        case XML_RELAXNG_DATATYPE:
        case XML_RELAXNG_PARAM:
        case XML_RELAXNG_VALUE:
        case XML_RELAXNG_LIST:
        case XML_RELAXNG_ATTRIBUTE:
            ret = 0;
            break;
        case XML_RELAXNG_CHOICE:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 0)
                        goto done;
                    list = list->next;
                }
                ret = 0;
                break;
            }
        case XML_RELAXNG_START:
        case XML_RELAXNG_INTERLEAVE:
        case XML_RELAXNG_GROUP:{
                xmlRelaxNGDefinePtr list = define->content;

                while (list != NULL) {
                    ret = xmlRelaxNGIsNullable(list);
                    if (ret != 1)
                        goto done;
                    list = list->next;
                }
                return (1);
            }
        default:
            return (-1);
    }
  done:
    if (ret == 0)
        define->dflags |= IS_NOT_NULLABLE;
    if (ret == 1)
        define->dflags |= IS_NULLABLE;
    return (ret);
}